

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int gid__;
  SaveBlock save;
  LoadBlock load_;
  FILE *f;
  int iVar1;
  undefined8 *puVar2;
  time_t tVar3;
  Link *l;
  undefined4 *b;
  size_t i;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  BlockID neighbor;
  undefined8 in_stack_ffffffffffffe730;
  _Manager_type in_stack_ffffffffffffe738;
  _Manager_type in_stack_ffffffffffffe740;
  _Invoker_type in_stack_ffffffffffffe748;
  environment env;
  undefined4 local_18ac;
  communicator world;
  communicator local_1890;
  Skip local_1878;
  RoundRobinAssigner assigner;
  code *local_1848 [2];
  code *local_1838;
  code *local_1830;
  code *local_1828 [2];
  code *local_1818;
  code *local_1810;
  code *local_1808 [2];
  code *local_17f8;
  code *local_17f0;
  code *local_17e8 [2];
  code *local_17d8;
  code *local_17d0;
  vector<int,_std::allocator<int>_> gids;
  _Any_data local_17a8;
  code *local_1798;
  code *local_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  code *local_1778;
  code *local_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  code *local_1758;
  code *local_1750;
  _Any_data local_1748;
  code *local_1738;
  code *local_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  code *local_1718;
  code *local_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  code *local_16f8;
  code *local_16f0;
  FileStorage storage;
  Master master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&master,"./DIY.XXXXXX",(allocator<char> *)&neighbor);
  diy::FileStorage::FileStorage(&storage,(string *)&master);
  std::__cxx11::string::~string((string *)&master);
  iVar1 = world.size_;
  local_1890.comm_.data = world.comm_.data;
  local_1890.rank_ = world.rank_;
  local_1890.size_ = world.size_;
  local_1890.owner_ = false;
  local_17e8[1] = (code *)0x0;
  local_17e8[0] = create_block;
  local_17d0 = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
  local_17d8 = std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
  local_1808[1] = (code *)0x0;
  local_1808[0] = destroy_block;
  local_17f0 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
  local_1828[1] = (code *)0x0;
  local_17f8 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
  local_1828[0] = save_block;
  local_1810 = std::
               _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
               ::_M_invoke;
  local_1848[1] = (code *)0x0;
  local_1818 = std::
               _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
               ::_M_manager;
  local_1848[0] = load_block;
  local_1830 = std::
               _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
               ::_M_invoke;
  local_1838 = std::
               _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
               ::_M_manager;
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = &PTR_unload_incoming_0013e5b0;
  puVar2[1] = 0x1000;
  iVar5 = 2;
  save.super__Function_base._M_functor._8_8_ = local_1848;
  save.super__Function_base._M_functor._M_unused._M_object = local_1828;
  save.super__Function_base._M_manager = (_Manager_type)puVar2;
  save._M_invoker._0_4_ = neighbor.gid;
  save._M_invoker._4_4_ = neighbor.proc;
  load_.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffe738;
  load_.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffe730;
  load_.super__Function_base._M_manager = in_stack_ffffffffffffe740;
  load_._M_invoker = in_stack_ffffffffffffe748;
  diy::Master::Master(&master,&local_1890,2,-1,(CreateBlock *)local_17e8,(DestroyBlock *)local_1808,
                      &storage.super_ExternalStorage,save,load_,
                      (QueuePolicy *)CONCAT44(local_18ac,env.provided_threading));
  std::_Function_base::~_Function_base((_Function_base *)local_1848);
  std::_Function_base::~_Function_base((_Function_base *)local_1828);
  std::_Function_base::~_Function_base((_Function_base *)local_1808);
  std::_Function_base::~_Function_base((_Function_base *)local_17e8);
  diy::mpi::communicator::~communicator(&local_1890);
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
  assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
       (_func_int **)&PTR__Assigner_0013e608;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  assigner.super_StaticAssigner.super_Assigner.nblocks_ = iVar1 * 0x18;
  diy::RoundRobinAssigner::local_gids(&assigner,world.rank_,&gids);
  for (uVar4 = 0;
      uVar4 < (ulong)((long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
    gid__ = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar4];
    l = (Link *)operator_new(0x20);
    (l->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0013e688;
    (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (gid__ < iVar1 * 0x18 + -1) {
      neighbor.gid = gid__ + 1;
      neighbor.proc = neighbor.gid % assigner.super_StaticAssigner.super_Assigner.size_;
      std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back(&l->neighbors_,&neighbor);
    }
    if (0 < gid__) {
      neighbor.gid = gid__ + -1;
      neighbor.proc = neighbor.gid % assigner.super_StaticAssigner.super_Assigner.size_;
      std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back(&l->neighbors_,&neighbor);
    }
    b = (undefined4 *)operator_new(4);
    *b = 0;
    diy::Master::add(&master,gid__,b,l);
  }
  while (f = _stderr, bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    local_1878.super__Function_base._M_functor._M_unused._M_object = enq;
    neighbor.gid = 0;
    neighbor.proc = 0;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)&local_1878,(Skip *)&neighbor);
    std::_Function_base::~_Function_base((_Function_base *)&neighbor);
    local_1748._M_unused._M_object = (void *)0x0;
    local_1748._8_8_ = 0;
    local_1730 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_1738 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_1728 = 0;
    uStack_1720 = 0;
    local_1710 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_1718 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_1708 = 0;
    uStack_1700 = 0;
    local_16f0 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_16f8 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::exchange(&master,false,(MemoryManagement *)&local_1748);
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)&local_1748);
    local_1878.super__Function_base._M_functor._M_unused._M_object = deq;
    neighbor.gid = 0;
    neighbor.proc = 0;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)&local_1878,(Skip *)&neighbor);
    std::_Function_base::~_Function_base((_Function_base *)&neighbor);
    local_1878.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_1878.super__Function_base._M_functor._8_8_ = 0;
    local_1878._M_invoker =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
    local_1878.super__Function_base._M_manager =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
    ;
    neighbor = (BlockID)&assigner;
    diy::Master::foreach_<Block>(&master,(Callback<Block> *)&neighbor,&local_1878);
    std::_Function_base::~_Function_base((_Function_base *)&neighbor);
    std::_Function_base::~_Function_base(&local_1878.super__Function_base);
    local_17a8._M_unused._M_object = (void *)0x0;
    local_17a8._8_8_ = 0;
    local_1790 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_1798 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_1788 = 0;
    uStack_1780 = 0;
    local_1770 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_1778 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_1768 = 0;
    uStack_1760 = 0;
    local_1750 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_1758 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::exchange(&master,true,(MemoryManagement *)&local_17a8);
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)&local_17a8);
    local_1878.super__Function_base._M_functor._M_unused._M_object = remote_deq;
    neighbor.gid = 0;
    neighbor.proc = 0;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)&local_1878,(Skip *)&neighbor);
    std::_Function_base::~_Function_base((_Function_base *)&neighbor);
  }
  if (world.rank_ == 0) {
    iVar5 = diy::Collection::available(&master.blocks_);
    fmt::v7::print<char[22],int&,char>
              (f,(char (*) [22])"Total iterations: {}\n",
               (int *)master.blocks_.elements_.super__Vector_base<void_*,_std::allocator<void_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar5]);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&gids.super__Vector_base<int,_std::allocator<int>_>);
  diy::Master::~Master(&master);
  diy::FileStorage::~FileStorage(&storage);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
//     diy::create_logger("trace");

    diy::mpi::environment     env(argc, argv);
    diy::mpi::communicator    world;
    diy::FileStorage          storage("./DIY.XXXXXX");
    int                       nblocks    = 24 * world.size();
//     int                       threads    = 1;
    int                       threads    = 2;
    int                       mem_blocks = -1;

    diy::Master               master(world,
                                     threads,
                                     mem_blocks,
                                     &create_block,
                                     &destroy_block,
                                     &storage,
                                     &save_block,
                                     &load_block);

    srand(static_cast<unsigned int>(time(NULL)));

    diy::RoundRobinAssigner   assigner(world.size(), nblocks);

    // this example creates a linear chain of blocks with links between adjacent blocks
    std::vector<int> gids;                     // global ids of local blocks
    assigner.local_gids(world.rank(), gids);   // get the gids of local blocks
    for (size_t i = 0; i < gids.size(); ++i)   // for the local blocks in this processor
    {
        int gid = gids[i];

        diy::Link*   link = new diy::Link;   // link is this block's neighborhood
        diy::BlockID neighbor;               // one neighbor in the neighborhood
        if (gid < nblocks - 1)               // RH neighbors for all but the last block in the global domain
        {
            neighbor.gid  = gid + 1;                     // gid of the neighbor block
            neighbor.proc = assigner.rank(neighbor.gid); // process of the neighbor block
            link->add_neighbor(neighbor);                // add the neighbor block to the link
        }
        if (gid > 0)                         // LH neighbors for all but the first block in the global domain
        {
            neighbor.gid  = gid - 1;
            neighbor.proc = assigner.rank(neighbor.gid);
            link->add_neighbor(neighbor);
        }

        master.add(gid, new Block, link);    // add the current local block to the master
    }

    int num_iters = 2;
    for (int i = 0; i < num_iters; i++)
    {
        // exchange some data inside the links
        master.foreach(&enq);
        master.exchange();
        master.foreach(&deq);

        // (remote) exchange some data outside the links
        master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
                { remote_enq(b, cp, assigner); });
        bool remote = true;
        master.exchange(remote);
        master.foreach(&remote_deq);
    }

    if (world.rank() == 0)
        fmt::print(stderr,
                   "Total iterations: {}\n", master.block<Block>(master.loaded_block())->count);

}